

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::test(ProgramBinaryPersistenceCase *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  TestLog *log;
  RenderContext *renderCtx;
  TestLog *log_00;
  Shader *this_01;
  Shader *this_02;
  char *__to;
  char *__from;
  Program program;
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  ProgramBinary binary;
  
  log = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  renderCtx = ((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx;
  shaders.m_srcGen = &sourceGen.super_SourceGenerator;
  sourceGen.super_SourceGenerator._vptr_SourceGenerator =
       (_func_int **)&PTR__ConstantShaderGenerator_00c0b738;
  sourceGen.m_rnd.m_rnd.x = (this->m_rnd).m_rnd.x;
  sourceGen.m_rnd.m_rnd.y = (this->m_rnd).m_rnd.y;
  sourceGen.m_rnd.m_rnd.z = (this->m_rnd).m_rnd.z;
  sourceGen.m_rnd.m_rnd.w = (this->m_rnd).m_rnd.w;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shaders.m_context = renderCtx;
  shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::Program::Program(&program,renderCtx);
  log_00 = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  this_01 = anon_unknown_0::ShaderAllocator::createShader(&shaders,SHADERTYPE_VERTEX);
  this_02 = anon_unknown_0::ShaderAllocator::createShader(&shaders,SHADERTYPE_FRAGMENT);
  glu::Shader::compile(this_01);
  glu::Shader::compile(this_02);
  glu::Program::attachShader(&program,this_01->m_shader);
  __from = (char *)(ulong)this_02->m_shader;
  glu::Program::attachShader(&program,this_02->m_shader);
  glu::Program::link(&program,__from,__to);
  anon_unknown_0::logProgram
            (log_00,((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx,&program
             ,&shaders);
  if (program.m_info.linkOk == true) {
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ProgramBinaryCase::getProgramBinary(&this->super_ProgramBinaryCase,&binary,program.m_program);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6]
    )(this,&program,&shaders);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,&program,&binary);
    anon_unknown_0::logProgram(log,renderCtx,&program,&shaders);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    this_00 = &binary.data;
    binary._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Fail, couldn\'t link program.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&binary,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program(&program);
  anon_unknown_0::ShaderAllocator::~ShaderAllocator(&shaders);
  return;
}

Assistant:

void ProgramBinaryPersistenceCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		ProgramBinary binary;
		getProgramBinary(binary, program.getProgram());

		executeForProgram(program, shaders);

		verify(program, binary);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}